

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
unicode_cpts_normalize_nfd
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *cpts)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  size_t i;
  long lVar4;
  uint uVar5;
  undefined1 *puVar6;
  ulong uVar7;
  uint *puVar8;
  difference_type __d;
  size_type sVar9;
  uint32_t cpt;
  allocator_type local_25;
  uint local_24;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_25);
  puVar1 = (cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 != (long)puVar2 - (long)puVar1 >> 2; lVar4 = lVar4 + 1) {
    uVar5 = puVar1[lVar4];
    puVar6 = _ZGR18unicode_ranges_nfd_;
    sVar9 = 0x724;
    while (uVar7 = sVar9, 0 < (long)uVar7) {
      sVar9 = uVar7 >> 1;
      if (*(uint *)(puVar6 + sVar9 * 0xc) <= uVar5) {
        puVar6 = puVar6 + (sVar9 + 1) * 0xc;
        sVar9 = ~sVar9 + uVar7;
      }
    }
    if (*(uint *)(puVar6 + -0xc) <= uVar5) {
      puVar8 = (uint *)(puVar6 + -4);
      if (*(uint *)(puVar6 + -8) < uVar5) {
        puVar8 = &local_24;
      }
      uVar5 = *puVar8;
    }
    puVar3[lVar4] = uVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> unicode_cpts_normalize_nfd(const std::vector<uint32_t> & cpts) {
    auto comp = [] (const uint32_t cpt, const range_nfd & range) {
        return cpt < range.first;
    };
    std::vector<uint32_t> result(cpts.size());
    for (size_t i = 0; i < cpts.size(); ++i) {
        const uint32_t cpt = cpts[i];
        auto it = std::upper_bound(unicode_ranges_nfd.begin(), unicode_ranges_nfd.end(), cpt, comp) - 1;
        result[i] = (it->first <= cpt && cpt <= it->last) ? it->nfd : cpt;
    }
    return result;
}